

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# adt_hash.c
# Opt level: O3

void adt_hnode_destroy(adt_hnode_t *node,_func_void_void_ptr *pDestructor)

{
  adt_hkey_tag *paVar1;
  byte bVar2;
  adt_hkey_t *hkey;
  ulong uVar3;
  long lVar4;
  
  if (node->u8Width < 0x10) {
    bVar2 = node->u8Cur;
    if (bVar2 != 0) {
      uVar3 = 0;
      do {
        hkey = (node->child).match[uVar3].key;
        if (hkey != (adt_hkey_t *)0x0) {
          do {
            paVar1 = hkey->next;
            adt_hkey_delete(hkey,pDestructor);
            hkey = paVar1;
          } while (paVar1 != (adt_hkey_tag *)0x0);
          bVar2 = node->u8Cur;
        }
        uVar3 = uVar3 + 1;
      } while (uVar3 < bVar2);
    }
  }
  else {
    if (node->u8Width != 0x10) {
      __assert_fail("node->u8Width==16",
                    "/workspace/llm4binary/github/license_all_cmakelists_1510/cogu[P]c-apx/adt/src/adt_hash.c"
                    ,300,"void adt_hnode_destroy(adt_hnode_t *, void (*)(void *))");
    }
    lVar4 = 0;
    do {
      adt_hnode_destroy((adt_hnode_t *)((long)&((node->child).match)->u32Hash + lVar4),pDestructor);
      lVar4 = lVar4 + 0x10;
    } while (lVar4 != 0x100);
  }
  free((node->child).match);
  return;
}

Assistant:

void adt_hnode_destroy(adt_hnode_t *node,void (*pDestructor)(void*)){
	if(node->u8Width<16){
		int i;
		for(i=0;i<node->u8Cur;i++){
			adt_hkey_t *hkey = node->child.match[i].key;
			while( hkey ){
				adt_hkey_t *next = hkey->next;
				adt_hkey_delete(hkey,pDestructor);
				hkey = next;
			}
		}
		free(node->child.match);
	}
	else{
      uint8_t i;
      assert(node->u8Width==16);
		for(i=0;i<16;i++){
			adt_hnode_destroy(&node->child.node[i],pDestructor);
		}
		free(node->child.node);
	}
}